

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QCss::Value>::reallocateAndGrow
          (QArrayDataPointer<QCss::Value> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QCss::Value> *old)

{
  Value *pVVar1;
  undefined8 *puVar2;
  QArrayData *pQVar3;
  Data *pDVar4;
  Value *pVVar5;
  bool bVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  qsizetype qVar11;
  Value *pVVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QArrayDataPointer<QCss::Value> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QCss::Value> *)0x0 && where == GrowsAtEnd) {
    pQVar3 = &this->d->super_QArrayData;
    if (pQVar3 == (QArrayData *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pQVar3 == (QArrayData *)0x0) {
        qVar11 = 0;
        lVar10 = 0;
      }
      else {
        qVar11 = pQVar3->alloc;
        lVar10 = (this->size - pQVar3->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar3[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                 -0x3333333333333333;
      }
      auVar13 = QArrayData::reallocateUnaligned(pQVar3,this->ptr,0x28,qVar11 + n + lVar10,Grow);
      this->d = (Data *)auVar13._0_8_;
      this->ptr = (Value *)auVar13._8_8_;
      goto LAB_00526176;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (Value *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pVVar5 = local_48.ptr;
  if (this->size != 0) {
    lVar10 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pVVar12 = this->ptr;
    pVVar1 = pVVar12 + lVar10;
    if ((old != (QArrayDataPointer<QCss::Value> *)0x0) || (bVar6)) {
      if ((lVar10 != 0) && (0 < lVar10)) {
        do {
          *(Type *)((long)(&pVVar5[local_48.size].variant + -1) + 0x18) = pVVar12->type;
          ::QVariant::QVariant(&pVVar5[local_48.size].variant,&pVVar12->variant);
          local_48.size = local_48.size + 1;
          pVVar12 = pVVar12 + 1;
        } while (pVVar12 < pVVar1);
      }
    }
    else if ((lVar10 != 0) && (0 < lVar10)) {
      do {
        local_48.ptr[local_48.size].type = pVVar12->type;
        pPVar7 = (pVVar12->variant).d.data.shared;
        uVar8 = *(undefined8 *)((long)&(pVVar12->variant).d.data + 8);
        uVar9 = *(undefined8 *)&(pVVar12->variant).d.field_0x18;
        puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].variant.d.data + 0x10);
        *puVar2 = *(undefined8 *)((long)&(pVVar12->variant).d.data + 0x10);
        puVar2[1] = uVar9;
        local_48.ptr[local_48.size].variant.d.data.shared = pPVar7;
        *(undefined8 *)((long)&local_48.ptr[local_48.size].variant.d.data + 8) = uVar8;
        (pVVar12->variant).d.data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(pVVar12->variant).d.data + 8) = 0;
        *(undefined8 *)((long)&(pVVar12->variant).d.data + 0x10) = 0;
        *(undefined8 *)&(pVVar12->variant).d.field_0x18 = 2;
        pVVar12 = pVVar12 + 1;
        local_48.size = local_48.size + 1;
      } while (pVVar12 < pVVar1);
    }
  }
  pDVar4 = this->d;
  pVVar5 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar11 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar4;
  local_48.ptr = pVVar5;
  local_48.size = qVar11;
  if (old != (QArrayDataPointer<QCss::Value> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar4;
    old->ptr = pVVar5;
    local_48.size = old->size;
    old->size = qVar11;
  }
  ~QArrayDataPointer(&local_48);
LAB_00526176:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }